

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

strbuf * ecdh_key_getkey_wrapper(ecdh_key *ek,ptrlen remoteKey)

{
  _Bool _Var1;
  strbuf *sb;
  ecdh_key *ek_local;
  ptrlen remoteKey_local;
  
  remoteKey_local.len = (size_t)strbuf_new();
  _Var1 = ecdh_key_getkey(ek,remoteKey,((strbuf *)remoteKey_local.len)->binarysink_);
  if (!_Var1) {
    strbuf_free((strbuf *)remoteKey_local.len);
    remoteKey_local.len = 0;
  }
  return (strbuf *)remoteKey_local.len;
}

Assistant:

strbuf *ecdh_key_getkey_wrapper(ecdh_key *ek, ptrlen remoteKey)
{
    /* Fold the boolean return value in C into the string return value
     * for this purpose, by returning NULL on failure */
    strbuf *sb = strbuf_new();
    if (!ecdh_key_getkey(ek, remoteKey, BinarySink_UPCAST(sb))) {
        strbuf_free(sb);
        return NULL;
    }
    return sb;
}